

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O2

void __thiscall sznet::net::EventLoopThreadPool::~EventLoopThreadPool(EventLoopThreadPool *this)

{
  std::_Vector_base<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>::
  ~_Vector_base(&(this->m_loops).
                 super__Vector_base<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>
               );
  std::
  vector<std::unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>,_std::allocator<std::unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>_>_>
  ::~vector(&this->m_threads);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

EventLoopThreadPool::~EventLoopThreadPool()
{
	// Don't delete m_baseLoop, it's stack variable
}